

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O1

void PHYSFS_utf8FromUtf16(PHYSFS_uint16 *src,char *dst,PHYSFS_uint64 len)

{
  ushort uVar1;
  ushort *puVar2;
  uint uVar3;
  PHYSFS_uint32 cp;
  PHYSFS_uint64 local_30;
  char *local_28;
  
  if (len != 0) {
    local_30 = len - 1;
    local_28 = dst;
    if (local_30 != 0) {
      do {
        uVar1 = *src;
        if (uVar1 == 0) {
          cp = 0;
          puVar2 = src;
        }
        else {
          puVar2 = src + 1;
          uVar3 = uVar1 & 0xfc00;
          cp = 0x3f;
          if (((uVar3 != 0xdc00) && (cp = (uint)uVar1, uVar3 == 0xd800)) &&
             (cp = 0x3f, 0xfbff < (ushort)(*puVar2 + 0x2000))) {
            cp = (uint)uVar1 * 0x400 + (uint)*puVar2 + 0xfc9f2400;
            puVar2 = src + 2;
          }
        }
        src = puVar2;
      } while ((cp != 0) && (utf8fromcodepoint(cp,&local_28,&local_30), local_30 != 0));
    }
    *local_28 = '\0';
  }
  return;
}

Assistant:

void PHYSFS_utf8FromUtf16(const PHYSFS_uint16 *src, char *dst, PHYSFS_uint64 len)
{
    if (len == 0)
        return;

    len--;
    while (len)
    {
        const PHYSFS_uint32 cp = utf16codepoint(&src);
        if (!cp)
            break;
        utf8fromcodepoint(cp, &dst, &len);
    } /* while */

    *dst = '\0';
}